

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O0

RecyclerWeakReferenceBase * __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::Add
          (WeakReferenceHashTable<PrimePolicy> *this,char *strongReference,Recycler *recycler)

{
  hash_t targetBucket_00;
  RecyclerWeakReferenceBase *entry;
  uint targetBucket;
  Recycler *recycler_local;
  char *strongReference_local;
  WeakReferenceHashTable<PrimePolicy> *this_local;
  
  targetBucket_00 = HashKeyToBucket(this,strongReference,this->size);
  this_local = (WeakReferenceHashTable<PrimePolicy> *)
               FindEntry(this,strongReference,targetBucket_00);
  if (this_local == (WeakReferenceHashTable<PrimePolicy> *)0x0) {
    this_local = (WeakReferenceHashTable<PrimePolicy> *)
                 Create(this,strongReference,targetBucket_00,recycler);
  }
  return (RecyclerWeakReferenceBase *)this_local;
}

Assistant:

RecyclerWeakReferenceBase* Add(char* strongReference, Recycler * recycler)
    {
        uint targetBucket = HashKeyToBucket(strongReference, size);
        RecyclerWeakReferenceBase* entry = FindEntry(strongReference, targetBucket);
        if (entry != nullptr)
        {
            return entry;
        }

        return Create(strongReference, targetBucket, recycler);
    }